

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

int tcache_create_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                     size_t newlen)

{
  _Bool _Var1;
  undefined4 *in_RCX;
  ulong *in_R8;
  long in_R9;
  size_t copylen;
  uint tcache_ind;
  int ret;
  size_t local_48;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar2;
  
  if ((in_R9 == 0) && (copylen == 0)) {
    _Var1 = tcaches_create((tsd_t *)0x0,
                           (uint *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (_Var1) {
      iVar2 = 0xe;
    }
    else {
      if ((in_RCX != (undefined4 *)0x0) && (in_R8 != (ulong *)0x0)) {
        if (*in_R8 != 4) {
          if (*in_R8 < 4) {
            local_48 = *in_R8;
          }
          else {
            local_48 = 4;
          }
          memcpy(in_RCX,&stack0xffffffffffffffc8,local_48);
          return 0x16;
        }
        *in_RCX = in_stack_ffffffffffffffc8;
      }
      iVar2 = 0;
    }
  }
  else {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int
tcache_create_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	unsigned tcache_ind;

	READONLY();
	if (tcaches_create(tsd, &tcache_ind)) {
		ret = EFAULT;
		goto label_return;
	}
	READ(tcache_ind, unsigned);

	ret = 0;
label_return:
	return ret;
}